

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

uint8_t * lib_read_lfunc(lua_State *L,uint8_t *p,GCtab *tab)

{
  byte bVar1;
  GCproto *pt_00;
  GCfunc *pGVar2;
  TValue *pTVar3;
  GCfunc *fn;
  GCproto *pt;
  LexState ls;
  GCstr *name;
  int len;
  GCtab *tab_local;
  uint8_t *p_local;
  lua_State *L_local;
  
  bVar1 = *p;
  ls._176_8_ = lj_str_new(L,(char *)(p + 1),(long)(int)(uint)bVar1);
  memset(&pt,0,0xb8);
  ls.lookaheadval.u64 = (long)(p + 1) + (long)(int)(uint)bVar1;
  ls.p = (char *)0xffffffffffffffff;
  ls.pe._0_4_ = 0xffffffff;
  ls.bcstack._4_4_ = 2;
  ls.linenumber = ls.endmark;
  ls.lastline = ls._180_4_;
  ls.fs = (FuncState *)L;
  pt_00 = lj_bcread_proto((LexState *)&pt);
  pt_00->firstline = -1;
  pGVar2 = lj_func_newL_empty(L,pt_00,(GCtab *)(L->env).gcptr64);
  pTVar3 = lj_tab_setstr(L,tab,(GCstr *)ls._176_8_);
  pTVar3->u64 = (ulong)pGVar2 | 0xfffb800000000000;
  return (uint8_t *)ls.lookaheadval.u64;
}

Assistant:

static const uint8_t *lib_read_lfunc(lua_State *L, const uint8_t *p, GCtab *tab)
{
  int len = *p++;
  GCstr *name = lj_str_new(L, (const char *)p, len);
  LexState ls;
  GCproto *pt;
  GCfunc *fn;
  memset(&ls, 0, sizeof(ls));
  ls.L = L;
  ls.p = (const char *)(p+len);
  ls.pe = (const char *)~(uintptr_t)0;
  ls.c = -1;
  ls.level = (BCDUMP_F_STRIP|(LJ_BE*BCDUMP_F_BE));
  ls.chunkname = name;
  pt = lj_bcread_proto(&ls);
  pt->firstline = ~(BCLine)0;
  fn = lj_func_newL_empty(L, pt, tabref(L->env));
  /* NOBARRIER: See below for common barrier. */
  setfuncV(L, lj_tab_setstr(L, tab, name), fn);
  return (const uint8_t *)ls.p;
}